

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O3

void async_send_to_tester
               (pid_t tester_pid,char *word,_Bool completed,size_t total_processed,_Bool ignored,
               _Bool accepted)

{
  pid_t __pid;
  __pid_t pid;
  mqd_t tester_mq;
  uint uVar1;
  int iVar2;
  char local_68 [8];
  char tester_mq_name [36];
  
  unique0x100001eb = word;
  pid = fork();
  if (pid == -1) {
    err = true;
    return;
  }
  if (pid != 0) {
    await_forks = await_forks + 1;
    pid_list_emplace(children,pid,&err);
    return;
  }
  validator_mq_finish(false,validator_mq,&err);
  if (err == true) {
    async_send_to_tester_cold_1();
  }
  tester_mq_get_name_from_pid(tester_pid,local_68);
  tester_mq = tester_mq_start(false,local_68,&err);
  if (err == true) {
    async_send_to_tester_cold_2();
  }
  current_tester_mq = tester_mq;
  tester_mq_send(tester_mq,stack0xffffffffffffffc0,completed,total_processed,ignored,accepted,&err);
  if (err == true) {
    async_send_to_tester_cold_3();
  }
  uVar1 = getpid();
  log_formatted("%d - SND: %s, COMPLETED=%d, IGNORED=%d, ACCEPTED=%d, EXPECTED_RCD_PASSED=%d",
                (ulong)uVar1,stack0xffffffffffffffc0,(ulong)completed,(ulong)ignored,(ulong)accepted
                ,total_processed);
  tester_mq_finish(false,tester_mq,(char *)0x0,&err);
  if (err == true) {
    async_send_to_tester_cold_4();
  }
  __pid = main_pid;
  if (stack0xffffffffffffffc0 != (char *)0x0) {
    iVar2 = __libc_current_sigrtmin();
    iVar2 = kill(__pid,iVar2 + 1);
    err = iVar2 == -1;
    if (err) {
      async_send_to_tester_cold_5();
    }
  }
  exit(0);
}

Assistant:

static void async_send_to_tester(pid_t tester_pid, const char *word, bool completed, size_t total_processed, bool ignored,
                          bool accepted) {
    assert(err == false);

    char tester_mq_name[TESTER_MQ_NAME_LEN];
    mqd_t tester_mq;
    pid_t child_pid;
    switch (child_pid = fork()) {
        case -1:
            err = true;
            break;
        case 0:
            validator_mq_finish(false, validator_mq, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to finish validator mq in async child");

            tester_mq_get_name_from_pid(tester_pid, tester_mq_name);
            tester_mq = tester_mq_start(false, tester_mq_name, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to open tester mq in async child");
            current_tester_mq = tester_mq; // for optimal error handling

            tester_mq_send(tester_mq, word, completed, total_processed, ignored, accepted, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to send to tester mq in async child");
            log_formatted("%d - SND: %s, COMPLETED=%d, IGNORED=%d, ACCEPTED=%d, EXPECTED_RCD_PASSED=%d", getpid(), word, completed, ignored, accepted, total_processed);

            tester_mq_finish(false, tester_mq, NULL, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to close tester mq in async child");

            if(word) {
                int tmp_err = kill(main_pid, SIG_SNT_SUCCESS);
                err = (tmp_err == -1);
                HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed notify main process about successful send");
            }
            exit(EXIT_SUCCESS);

        default:
            await_forks++;
            pid_list_emplace(children, child_pid, &err);
            break;
    }
}